

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O2

void __thiscall
BattleWithLandlord::BattleWithLandlord(BattleWithLandlord *this,istream *is,ostream *os)

{
  unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *this_00;
  long lVar1;
  key_type kVar2;
  long lVar3;
  mapped_type *pmVar4;
  char cVar5;
  key_type local_7a;
  char local_79;
  thread *local_78;
  HashCache *local_70;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_68;
  
  (this->_name2id)._M_h._M_buckets = &(this->_name2id)._M_h._M_single_bucket;
  (this->_name2id)._M_h._M_bucket_count = 1;
  (this->_name2id)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_name2id)._M_h._M_element_count = 0;
  (this->_name2id)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_name2id)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_name2id)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &this->_id2name;
  (this->_id2name)._M_h._M_buckets = &(this->_id2name)._M_h._M_single_bucket;
  (this->_id2name)._M_h._M_bucket_count = 1;
  (this->_id2name)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_id2name)._M_h._M_element_count = 0;
  (this->_id2name)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_id2name)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_id2name)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar3 = 0x78;
  do {
    lVar1 = (long)this->_cards + lVar3 + -0x70;
    *(undefined4 *)((long)this->_cards + lVar3 + -0x70) = 0;
    *(undefined8 *)((long)this->_cards + lVar3 + -0x68) = 0;
    *(long *)((long)&((__node_base *)(this->_cards + -2))->_M_nxt + lVar3) = lVar1;
    *(long *)((long)this->_cards + lVar3 + -0x58) = lVar1;
    *(undefined8 *)((long)this->_cards + lVar3 + -0x50) = 0;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0xd8);
  (this->_pv).super__List_base<CardStyle,_std::allocator<CardStyle>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->_pv;
  (this->_pv).super__List_base<CardStyle,_std::allocator<CardStyle>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->_pv;
  (this->_pv).super__List_base<CardStyle,_std::allocator<CardStyle>_>._M_impl._M_node._M_size = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  CardStyle::CardStyle
            (&this->_last,PASS,0,(multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_68
             ,1,0);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_68);
  (this->_hash)._table._M_h._M_buckets = &(this->_hash)._table._M_h._M_single_bucket;
  (this->_hash)._table._M_h._M_bucket_count = 1;
  (this->_hash)._table._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_hash)._table._M_h._M_element_count = 0;
  (this->_hash)._table._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_hash)._it.
  super__Node_iterator_base<std::pair<const_HashCache::Key,_HashCache::Value>,_true>._M_cur =
       (__node_type *)0x0;
  local_70 = &this->_hash;
  (this->_hash)._table._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_hash)._table._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->_is = is;
  this->_os = os;
  local_78 = &this->_thread;
  (this->_thread)._M_id._M_thread = 0;
  (this->_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->_mtx2).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mtx2).super___mutex_base._M_mutex + 8) = 0;
  (this->_mtx2).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->_mtx2).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mtx2).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  cVar5 = '3';
  while (cVar5 < ':') {
    local_7a = cVar5;
    pmVar4 = std::__detail::
             _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_7a);
    kVar2 = local_7a;
    *pmVar4 = cVar5 + -0x30;
    local_79 = local_7a + -0x30;
    pmVar4 = std::__detail::
             _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_79);
    *pmVar4 = kVar2;
    cVar5 = local_7a + '\x01';
  }
  local_7a = '0';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = '\n';
  local_7a = '\n';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = '0';
  local_7a = 'J';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = '\v';
  local_7a = '\v';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = 'J';
  local_7a = 'Q';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = '\f';
  local_7a = '\f';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = 'Q';
  local_7a = 'K';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = '\r';
  local_7a = '\r';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = 'K';
  local_7a = 'A';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = '\x0e';
  local_7a = '\x0e';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = 'A';
  local_7a = '2';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = '\x10';
  local_7a = '\x10';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = '2';
  local_7a = 'c';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = '\x11';
  local_7a = '\x11';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = 'c';
  local_7a = 'C';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = '\x12';
  local_7a = '\x12';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = 'C';
  local_7a = 'x';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = -9;
  local_7a = -9;
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = 'x';
  local_7a = 'y';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = -7;
  local_7a = -7;
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = 'y';
  local_7a = 'z';
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_7a);
  *pmVar4 = -5;
  local_7a = -5;
  pmVar4 = std::__detail::
           _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_7a);
  *pmVar4 = 'z';
  this->_ready = false;
  return;
}

Assistant:

BattleWithLandlord::BattleWithLandlord(istream &is, ostream &os):_is(is), _os(os) {
    for (char c = '3'; c <= '9'; ++c) {
        _name2id[c] = c - '0';
        _id2name[c - '0'] = c;
    }
    _name2id['0'] = 10; _id2name[10] = '0';
    _name2id['J'] = 11; _id2name[11] = 'J';
    _name2id['Q'] = 12; _id2name[12] = 'Q';
    _name2id['K'] = 13; _id2name[13] = 'K';
    _name2id['A'] = 14; _id2name[14] = 'A';
    _name2id['2'] = 16; _id2name[16] = '2';
    _name2id['c'] = 17; _id2name[17] = 'c';
    _name2id['C'] = 18; _id2name[18] = 'C'; //Clown
    _name2id['x'] = -9; _id2name[-9] = 'x';
    _name2id['y'] = -7; _id2name[-7] = 'y';
    _name2id['z'] = -5; _id2name[-5] = 'z';
    _ready = false;
}